

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPizCompressor.cpp
# Opt level: O3

int __thiscall
Imf_2_5::PizCompressor::uncompress
          (PizCompressor *this,char *inPtr,int inSize,int minY,char **outPtr)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Box2i local_40;
  
  iVar3 = this->_minX;
  iVar1 = this->_maxX;
  iVar2 = (*(this->super_Compressor)._vptr_Compressor[2])();
  local_40.max.y = iVar2 + minY + -1;
  local_40.min.x = iVar3;
  local_40.min.y = minY;
  local_40.max.x = iVar1;
  iVar3 = uncompress(this,inPtr,inSize,&local_40,outPtr);
  return iVar3;
}

Assistant:

int
PizCompressor::uncompress (const char *inPtr,
			   int inSize,
			   int minY,
			   const char *&outPtr)
{
    return uncompress (inPtr,
		       inSize,
		       Box2i (V2i (_minX, minY),
			      V2i (_maxX, minY + numScanLines() - 1)),
		       outPtr);
}